

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  MQTT *s;
  
  s = (data->req).p.mqtt;
  Curl_dyn_free(&s->sendbuf);
  Curl_dyn_free(&s->recvbuf);
  return CURLE_OK;
}

Assistant:

static CURLcode mqtt_done(struct Curl_easy *data,
                          CURLcode status, bool premature)
{
  struct MQTT *mq = data->req.p.mqtt;
  (void)status;
  (void)premature;
  Curl_dyn_free(&mq->sendbuf);
  Curl_dyn_free(&mq->recvbuf);
  return CURLE_OK;
}